

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O0

void __thiscall helics::Federate::enteringExecutingMode(Federate *this,iteration_time res)

{
  bool bVar1;
  ulong uVar2;
  byte in_DL;
  long in_RSI;
  long *in_RDI;
  undefined1 __args_1;
  function<void_(TimeRepresentation<count_time<9,_long>_>,_bool)> *in_stack_ffffffffffffffb8;
  IterationResult iterating;
  TimeRepresentation<count_time<9,_long>_> in_stack_ffffffffffffffc0;
  
  uVar2 = (ulong)in_DL;
  iterating = (IterationResult)((ulong)in_stack_ffffffffffffffb8 >> 0x38);
  switch(uVar2) {
  case 0:
    updateFederateMode((Federate *)in_stack_ffffffffffffffc0.internalTimeCode,iterating);
    __args_1 = (undefined1)(uVar2 >> 0x38);
    in_RDI[5] = in_RSI;
    bVar1 = std::function::operator_cast_to_bool
                      ((function<void_(TimeRepresentation<count_time<9,_long>_>,_bool)> *)0x25503d);
    if (bVar1) {
      std::function<void_(TimeRepresentation<count_time<9,_long>_>,_bool)>::operator()
                (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffc0,(bool)__args_1);
    }
    (**(code **)(*in_RDI + 0x60))(in_RDI,in_RSI,in_DL);
    bVar1 = std::function::operator_cast_to_bool
                      ((function<void_(TimeRepresentation<count_time<9,_long>_>,_bool)> *)0x2550a0);
    if (bVar1) {
      std::function<void_(TimeRepresentation<count_time<9,_long>_>,_bool)>::operator()
                (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffc0,(bool)__args_1);
    }
    break;
  case 2:
    in_RDI[5] = -1;
    enteringInitializingMode((Federate *)in_stack_ffffffffffffffc0.internalTimeCode,iterating);
    (**(code **)(*in_RDI + 0x60))(in_RDI,in_RSI,in_DL);
    break;
  case 3:
    updateFederateMode((Federate *)in_stack_ffffffffffffffc0.internalTimeCode,iterating);
    break;
  case 7:
    updateFederateMode((Federate *)in_stack_ffffffffffffffc0.internalTimeCode,iterating);
  }
  return;
}

Assistant:

void Federate::enteringExecutingMode(iteration_time res)
{
    switch (res.state) {
        case IterationResult::NEXT_STEP:
            updateFederateMode(Modes::EXECUTING);

            mCurrentTime = res.grantedTime;
            if (timeUpdateCallback) {
                timeUpdateCallback(mCurrentTime, false);
            }
            initializeToExecuteStateTransition(res);
            if (timeRequestReturnCallback) {
                timeRequestReturnCallback(mCurrentTime, false);
            }
            break;
        case IterationResult::ITERATING:
            mCurrentTime = initializationTime;

            enteringInitializingMode(res.state);

            initializeToExecuteStateTransition(res);
            break;
        case IterationResult::ERROR_RESULT:
            updateFederateMode(Modes::ERROR_STATE);
            break;
        case IterationResult::HALTED:
            updateFederateMode(Modes::FINISHED);
            break;
    }
}